

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHandlerCSV.cpp
# Opt level: O0

Database __thiscall DataHandlerCSV::getDataToProcess(DataHandlerCSV *this)

{
  DataHandlerCSV *this_local;
  
  return (this->super_DataHandler)._database;
}

Assistant:

Database DataHandlerCSV::getDataToProcess()
{
    return _database;
                
    /* Only one worker: no data distribution, return local database. */
	if (NUM_OF_WORKERS == 1)
		return _database;
	/*
	 * We have to merge all the received databases and the local one in order to obtain a unique database needed for processing.
	 * The first step consists in reallocating the needed capacity in _localDataToProcess; doing a single reallocation beforehand
	 * is more efficient than letting the insert method handle it with a worse case scenario of one reallocation per worker (one per insert below).
	 */
	for (size_t table = 0; table < NUM_OF_TABLES; ++table)
	{
		size_t sizeToReallocate = _localDataToProcess[table].size();

		for (size_t worker = 0; worker < NUM_OF_WORKERS; ++worker)
		{
			sizeToReallocate += _receivedDataToProcess[worker][table].size();
		}
		/* Increase capacity of the vector by adding up the sizes of all the vectors we are going to insert. */
		_localDataToProcess[table].reserve(sizeToReallocate);
	}

	/* Merge all the tables of _receivedDataToProcess into _localDataToProcess. */
	for (size_t table = 0; table < NUM_OF_TABLES; ++table)
	{
		for (size_t worker = 0; worker < NUM_OF_WORKERS; ++worker)
		{
			_localDataToProcess[table].insert(_localDataToProcess[table].end(),
					_receivedDataToProcess[worker][table].begin(),
					_receivedDataToProcess[worker][table].end());
		}
	}
	return _localDataToProcess;

}